

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O3

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  bool bVar1;
  FormatSinkImpl *sink;
  FormatArgImpl *pFVar2;
  FormatConversionSpecImpl conv;
  
  sink = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_);
  if (((ulong)arg.ptr & 0xff) == 0x13) {
    pFVar2 = (FormatArgImpl *)0x7fffffff;
    if (this < (FormatArgImpl *)0x7fffffff) {
      pFVar2 = this;
    }
    *(int *)&(sink->raw_).sink_ = (int)pFVar2;
    return true;
  }
  if ((2L << (arg.buf[0] & 0x3f) & 0x9fffaU) != 0) {
    conv.precision_ = spec._0_4_;
    conv._0_8_ = arg.ptr;
    bVar1 = ConvertIntArg<unsigned_long>((unsigned_long)this,conv,sink);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }